

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_constant_propagation.cpp
# Opt level: O1

ir_visitor_status __thiscall
anon_unknown.dwarf_8f10e::ir_constant_propagation_visitor::visit_enter
          (ir_constant_propagation_visitor *this,ir_call *ir)

{
  exec_node **ppeVar1;
  exec_node *peVar2;
  exec_node *peVar3;
  exec_list *peVar4;
  exec_node *peVar5;
  exec_node *peVar6;
  exec_node *peVar7;
  exec_node *peVar8;
  ir_rvalue *new_param;
  exec_node **local_38;
  
  peVar8 = (ir->actual_parameters).head_sentinel.next;
  peVar7 = (ir->callee->parameters).head_sentinel.next;
  peVar2 = peVar7->next;
  peVar3 = peVar8->next;
  if (peVar8->next != (exec_node *)0x0 && peVar7->next != (exec_node *)0x0) {
    do {
      peVar6 = peVar3;
      peVar5 = peVar2;
      if (1 < (*(uint *)&peVar7[3].prev >> 0xc & 0xf) - 7) {
        ppeVar1 = &peVar8[-1].prev;
        local_38 = ppeVar1;
        (*(this->super_ir_rvalue_visitor).super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor
          ._vptr_ir_hierarchical_visitor[0x28])(this,&local_38);
        if (local_38 == ppeVar1) {
          (*(code *)(*ppeVar1)[1].prev)(ppeVar1,this);
        }
        else {
          peVar7 = (exec_node *)(local_38 + 1);
          if (local_38 == (exec_node **)0x0) {
            peVar7 = (exec_node *)0x0;
          }
          peVar7->prev = peVar8->prev;
          peVar7->next = peVar8->next;
          peVar8->prev->next = peVar7;
          peVar8->next->prev = peVar7;
        }
      }
      peVar2 = peVar5->next;
    } while ((peVar2 != (exec_node *)0x0) &&
            (peVar3 = peVar6->next, peVar7 = peVar5, peVar8 = peVar6, peVar3 != (exec_node *)0x0));
  }
  peVar4 = this->acp;
  (peVar4->head_sentinel).next = &peVar4->tail_sentinel;
  (peVar4->head_sentinel).prev = (exec_node *)0x0;
  (peVar4->tail_sentinel).next = (exec_node *)0x0;
  (peVar4->tail_sentinel).prev = &peVar4->head_sentinel;
  this->killed_all = true;
  return visit_continue_with_parent;
}

Assistant:

ir_visitor_status
ir_constant_propagation_visitor::visit_enter(ir_call *ir)
{
   /* Do constant propagation on call parameters, but skip any out params */
   foreach_two_lists(formal_node, &ir->callee->parameters,
                     actual_node, &ir->actual_parameters) {
      ir_variable *sig_param = (ir_variable *) formal_node;
      ir_rvalue *param = (ir_rvalue *) actual_node;
      if (sig_param->data.mode != ir_var_function_out
          && sig_param->data.mode != ir_var_function_inout) {
	 ir_rvalue *new_param = param;
	 handle_rvalue(&new_param);
         if (new_param != param)
	    param->replace_with(new_param);
	 else
	    param->accept(this);
      }
   }

   /* Since we're unlinked, we don't (necssarily) know the side effects of
    * this call.  So kill all copies.
    */
   acp->make_empty();
   this->killed_all = true;

   return visit_continue_with_parent;
}